

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O1

void ExtendLastCommand(BrotliEncoderStateInternal *s,uint32_t *bytes,
                      uint32_t *wrapped_last_processed_pos)

{
  uint32_t uVar1;
  Command *pCVar2;
  size_t sVar3;
  uint8_t *puVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  uint8_t *puVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  size_t sVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  
  pCVar2 = s->commands_;
  sVar3 = s->num_commands_;
  uVar16 = (1L << ((byte)(s->params).lgwin & 0x3f)) - 0x10;
  uVar14 = (ulong)(pCVar2[sVar3 - 1].copy_len_ & 0x1ffffff);
  uVar11 = s->last_processed_pos_ - uVar14;
  if (uVar16 <= uVar11) {
    uVar11 = uVar16;
  }
  iVar10 = s->dist_cache_[0];
  uVar16 = (ulong)iVar10;
  uVar20 = pCVar2[sVar3 - 1].dist_prefix_ & 0x3ff;
  uVar1 = (s->params).dist.num_direct_distance_codes;
  if (uVar1 + 0x10 <= uVar20) {
    uVar13 = (s->params).dist.distance_postfix_bits;
    bVar9 = (byte)uVar13;
    uVar20 = (uVar20 - uVar1) - 0x10;
    uVar20 = (pCVar2[sVar3 - 1].dist_extra_ +
              (((uVar20 >> (uVar13 & 0x1f) & 1) != 0) + 2 <<
              ((byte)(pCVar2[sVar3 - 1].dist_prefix_ >> 10) & 0x1f)) + -4 << (bVar9 & 0x1f)) +
             (~(-1 << (bVar9 & 0x1f)) & uVar20) + uVar1 + 0x10;
  }
  if (uVar20 - 0xf == uVar16 || uVar20 < 0x10) {
    uVar20 = (s->ringbuffer_).mask_;
    puVar4 = (s->ringbuffer_).buffer_;
    uVar21 = uVar16 - uVar11;
    if (uVar16 < uVar11 || uVar21 == 0) {
      while ((*bytes != 0 &&
             (puVar4[*wrapped_last_processed_pos & uVar20] ==
              puVar4[*wrapped_last_processed_pos - iVar10 & uVar20]))) {
        pCVar2[sVar3 - 1].copy_len_ = pCVar2[sVar3 - 1].copy_len_ + 1;
        *bytes = *bytes - 1;
        *wrapped_last_processed_pos = *wrapped_last_processed_pos + 1;
      }
    }
    else {
      uVar11 = (s->params).dictionary.compound.total_size;
      if ((uVar21 - 1 < uVar11) && (uVar14 < uVar21)) {
        uVar14 = (uVar11 - uVar21) + uVar14;
        sVar17 = 0xffffffffffffffff;
        do {
          sVar18 = sVar17;
          uVar11 = (s->params).dictionary.compound.chunk_offsets[sVar18 + 2];
          sVar17 = sVar18 + 1;
        } while (uVar11 <= uVar14);
        if (*bytes != 0) {
          puVar12 = (s->params).dictionary.compound.chunk_source[sVar18 + 1];
          sVar17 = (s->params).dictionary.compound.chunk_offsets[sVar18 + 1];
          lVar19 = uVar11 - sVar17;
          lVar15 = uVar14 - sVar17;
          sVar17 = sVar18 + 1;
          do {
            if (puVar4[*wrapped_last_processed_pos & uVar20] != puVar12[lVar15]) break;
            pCVar2[sVar3 - 1].copy_len_ = pCVar2[sVar3 - 1].copy_len_ + 1;
            *bytes = *bytes - 1;
            *wrapped_last_processed_pos = *wrapped_last_processed_pos + 1;
            lVar15 = lVar15 + 1;
            sVar18 = sVar17;
            if (lVar15 == lVar19) {
              sVar18 = sVar17 + 1;
              if (sVar18 == (s->params).dictionary.compound.num_chunks) break;
              puVar12 = (s->params).dictionary.compound.chunk_source[sVar17 + 1];
              lVar19 = (s->params).dictionary.compound.chunk_offsets[sVar17 + 2] -
                       (s->params).dictionary.compound.chunk_offsets[sVar17 + 1];
              lVar15 = 0;
            }
            sVar17 = sVar18;
          } while (*bytes != 0);
        }
      }
    }
    uVar20 = pCVar2[sVar3 - 1].insert_len_;
    uVar7 = (pCVar2[sVar3 - 1].copy_len_ >> 0x19) + (pCVar2[sVar3 - 1].copy_len_ & 0x1ffffff);
    uVar13 = uVar20;
    if (5 < (ulong)uVar20) {
      if (uVar20 < 0x82) {
        uVar11 = (ulong)uVar20 - 2;
        uVar20 = 0x1f;
        uVar13 = (uint)uVar11;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        uVar13 = (int)(uVar11 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar20 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (uVar20 < 0x842) {
        uVar13 = 0x1f;
        if (uVar20 - 0x42 != 0) {
          for (; uVar20 - 0x42 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar13 = (uVar13 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar13 = 0x15;
        if (0x1841 < uVar20) {
          uVar13 = (uint)(ushort)(0x17 - (uVar20 < 0x5842));
        }
      }
    }
    if (uVar7 < 10) {
      uVar20 = uVar7 - 2;
    }
    else if (uVar7 < 0x86) {
      uVar20 = 0x1f;
      uVar8 = (uint)((ulong)uVar7 - 6);
      if (uVar8 != 0) {
        for (; uVar8 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      uVar20 = (int)((ulong)uVar7 - 6 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar20 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar20 = 0x17;
      if (uVar7 < 0x846) {
        uVar20 = 0x1f;
        if (uVar7 - 0x46 != 0) {
          for (; uVar7 - 0x46 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        uVar20 = (uVar20 ^ 0xffe0) + 0x2c;
      }
    }
    uVar5 = (ushort)uVar20;
    uVar6 = (uVar5 & 7) + ((ushort)uVar13 & 7) * 8;
    if ((((pCVar2[sVar3 - 1].dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar13 < 8)) && (uVar5 < 0x10))
    {
      if (7 < uVar5) {
        uVar6 = uVar6 | 0x40;
      }
    }
    else {
      iVar10 = ((uVar13 & 0xffff) >> 3) * 3 + ((uVar20 & 0xffff) >> 3);
      uVar6 = uVar6 + ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar10 * 0x40 + 0x40;
    }
    pCVar2[sVar3 - 1].cmd_prefix_ = uVar6;
  }
  return;
}

Assistant:

static void ExtendLastCommand(BrotliEncoderState* s, uint32_t* bytes,
                              uint32_t* wrapped_last_processed_pos) {
  Command* last_command = &s->commands_[s->num_commands_ - 1];
  const uint8_t* data = s->ringbuffer_.buffer_;
  const uint32_t mask = s->ringbuffer_.mask_;
  uint64_t max_backward_distance =
      (((uint64_t)1) << s->params.lgwin) - BROTLI_WINDOW_GAP;
  uint64_t last_copy_len = last_command->copy_len_ & 0x1FFFFFF;
  uint64_t last_processed_pos = s->last_processed_pos_ - last_copy_len;
  uint64_t max_distance = last_processed_pos < max_backward_distance ?
      last_processed_pos : max_backward_distance;
  uint64_t cmd_dist = (uint64_t)s->dist_cache_[0];
  uint32_t distance_code = CommandRestoreDistanceCode(last_command,
                                                      &s->params.dist);
  const CompoundDictionary* dict = &s->params.dictionary.compound;
  size_t compound_dictionary_size = dict->total_size;
  if (distance_code < BROTLI_NUM_DISTANCE_SHORT_CODES ||
      distance_code - (BROTLI_NUM_DISTANCE_SHORT_CODES - 1) == cmd_dist) {
    if (cmd_dist <= max_distance) {
      while (*bytes != 0 && data[*wrapped_last_processed_pos & mask] ==
             data[(*wrapped_last_processed_pos - cmd_dist) & mask]) {
        last_command->copy_len_++;
        (*bytes)--;
        (*wrapped_last_processed_pos)++;
      }
    } else {
      if ((cmd_dist - max_distance - 1) < compound_dictionary_size &&
          last_copy_len < cmd_dist - max_distance) {
        size_t address =
            compound_dictionary_size - (size_t)(cmd_dist - max_distance) +
            (size_t)last_copy_len;
        size_t br_index = 0;
        size_t br_offset;
        const uint8_t* chunk;
        size_t chunk_length;
        while (address >= dict->chunk_offsets[br_index + 1]) br_index++;
        br_offset = address - dict->chunk_offsets[br_index];
        chunk = dict->chunk_source[br_index];
        chunk_length =
            dict->chunk_offsets[br_index + 1] - dict->chunk_offsets[br_index];
        while (*bytes != 0 && data[*wrapped_last_processed_pos & mask] ==
               chunk[br_offset]) {
          last_command->copy_len_++;
          (*bytes)--;
          (*wrapped_last_processed_pos)++;
          if (++br_offset == chunk_length) {
            br_index++;
            br_offset = 0;
            if (br_index != dict->num_chunks) {
              chunk = dict->chunk_source[br_index];
              chunk_length = dict->chunk_offsets[br_index + 1] -
                  dict->chunk_offsets[br_index];
            } else {
              break;
            }
          }
        }
      }
    }
    /* The copy length is at most the metablock size, and thus expressible. */
    GetLengthCode(last_command->insert_len_,
                  (size_t)((int)(last_command->copy_len_ & 0x1FFFFFF) +
                           (int)(last_command->copy_len_ >> 25)),
                  TO_BROTLI_BOOL((last_command->dist_prefix_ & 0x3FF) == 0),
                  &last_command->cmd_prefix_);
  }
}